

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestPdu.cpp
# Opt level: O1

void __thiscall DIS::ActionRequestPdu::ActionRequestPdu(ActionRequestPdu *this)

{
  SimulationManagementFamilyPdu::SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  (this->super_SimulationManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ActionRequestPdu_001b3618;
  EntityID::EntityID(&this->_originatingID);
  EntityID::EntityID(&this->_receivingID);
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_requestID = 0;
  this->_actionID = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x10');
  return;
}

Assistant:

ActionRequestPdu::ActionRequestPdu() : SimulationManagementFamilyPdu(),
   _originatingID(), 
   _receivingID(), 
   _requestID(0), 
   _actionID(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 16 );
}